

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::WaitStatementSyntax::setChild
          (WaitStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00aeb450 + *(int *)(&DAT_00aeb450 + in_RSI * 4)))();
  return;
}

Assistant:

void WaitStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: wait = child.token(); return;
        case 3: openParen = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 5: closeParen = child.token(); return;
        case 6: statement = child.node() ? &child.node()->as<StatementSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}